

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serial.cpp
# Opt level: O1

bool __thiscall create::Serial::startReading(Serial *this)

{
  mutex *__mutex;
  impl_type *piVar1;
  reactor *prVar2;
  int iVar3;
  cv_status cVar4;
  long lVar5;
  size_t in_RCX;
  transfer_all_t *completion_cond;
  byte bVar6;
  int in_R8D;
  bool bVar7;
  uint8_t oc;
  unique_lock<std::mutex> lock;
  transfer_all_t local_81;
  undefined1 local_80 [8];
  undefined8 local_78;
  _Head_base<0UL,_boost::asio::io_context_*,_false> local_70;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_68;
  unique_lock<std::mutex> local_60;
  thread *local_50;
  undefined1 local_48 [8];
  epoll_data_t eStack_40;
  serial_port *local_38;
  
  if ((this->port).impl_.implementation_.descriptor_ != -1) {
    if ((this->data).super___shared_ptr<create::Data,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
        (element_type *)0x0) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"[create::Serial] ",0x11);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"data pointer not initialized.",0x1d);
      std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + 'x');
      std::ostream::put('x');
      std::ostream::flush();
    }
    else {
      bVar6 = 1;
      if (this->isReading != false) goto LAB_0013660a;
      local_80[0] = 0x80;
      send(this,(int)local_80,(void *)0x1,in_RCX,in_R8D);
      iVar3 = (**this->_vptr_Serial)(this);
      if ((char)iVar3 != '\0') {
        piVar1 = (this->io).impl_;
        if ((piVar1->mutex_).enabled_ == true) {
          __mutex = &(piVar1->mutex_).mutex_;
          pthread_mutex_lock((pthread_mutex_t *)__mutex);
          piVar1->stopped_ = false;
          pthread_mutex_unlock((pthread_mutex_t *)__mutex);
        }
        else {
          piVar1->stopped_ = false;
        }
        local_60._M_device = (mutex_type *)&this->byteRead;
        local_60._8_8_ = 1;
        std::__shared_ptr<create::Serial,(__gnu_cxx::_Lock_policy)2>::
        __shared_ptr<create::Serial,void>
                  ((__shared_ptr<create::Serial,(__gnu_cxx::_Lock_policy)2> *)local_48,
                   (__weak_ptr<create::Serial,_(__gnu_cxx::_Lock_policy)2> *)
                   &this->super_enable_shared_from_this<create::Serial>);
        local_80 = (undefined1  [8])onData;
        local_78 = 0;
        _Stack_68._M_pi =
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
             CONCAT44(eStack_40.u64._4_4_,eStack_40.fd);
        local_48._0_4_ = 0;
        local_48._4_4_ = 0;
        eStack_40.fd = 0;
        eStack_40.u64._4_4_ = 0;
        local_38 = &this->port;
        completion_cond = &local_81;
        boost::asio::detail::
        initiate_async_read_buffer_sequence<boost::asio::basic_serial_port<boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context&>,boost::asio::execution::detail::blocking::never_t<0>,boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>>>>>
        ::operator()((initiate_async_read_buffer_sequence<boost::asio::basic_serial_port<boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context&>,boost::asio::execution::detail::blocking::never_t<0>,boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>>>>>
                      *)&local_38,
                     (_Bind<void_(create::Serial::*(std::shared_ptr<create::Serial>,_std::_Placeholder<1>,_std::_Placeholder<2>))(const_boost::system::error_code_&,_const_unsigned_long_&)>
                      *)local_80,(mutable_buffers_1 *)&local_60,completion_cond);
        if (_Stack_68._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_68._M_pi);
        }
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
            CONCAT44(eStack_40.u64._4_4_,eStack_40.fd) !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                     CONCAT44(eStack_40.u64._4_4_,eStack_40.fd));
        }
        local_80 = (undefined1  [8])boost::asio::io_context::run;
        local_78 = 0;
        local_70._M_head_impl = &this->io;
        std::thread::
        thread<std::_Bind<unsigned_long(boost::asio::io_context::*(boost::asio::io_context*))()>,,void>
                  ((thread *)&local_60,
                   (_Bind<unsigned_long_(boost::asio::io_context::*(boost::asio::io_context_*))()> *
                   )local_80);
        if ((this->ioThread)._M_id._M_thread != 0) {
          std::terminate();
        }
        (this->ioThread)._M_id._M_thread = (native_handle_type)local_60._M_device;
        local_60._M_device = &this->dataReadyMut;
        local_60._8_8_ = local_60._8_8_ & 0xffffffffffffff00;
        std::unique_lock<std::mutex>::lock(&local_60);
        local_60._M_owns = true;
        bVar6 = this->dataReady;
        if ((bool)bVar6 == false) {
          local_50 = &this->ioThread;
          iVar3 = 1;
          do {
            lVar5 = std::chrono::_V2::steady_clock::now();
            local_80 = (undefined1  [8])(lVar5 + 500000000);
            cVar4 = std::condition_variable::
                    __wait_until_impl<std::chrono::duration<long,std::ratio<1l,1000000000l>>>
                              (&this->dataReadyCond,&local_60,
                               (time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                                *)local_80);
            if (cVar4 == timeout) {
              if (9 < iVar3) {
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cerr,"[create::Serial] ",0x11);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cerr,
                           "failed to receive data from Create. Check if robot is powered!",0x3e);
                std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + 'x');
                std::ostream::put('x');
                std::ostream::flush();
                piVar1 = (this->io).impl_;
                local_80 = (undefined1  [8])&piVar1->mutex_;
                bVar7 = (piVar1->mutex_).enabled_ == true;
                if (bVar7) {
                  pthread_mutex_lock((pthread_mutex_t *)&(piVar1->mutex_).mutex_);
                }
                local_78._0_1_ = bVar7;
                piVar1->stopped_ = true;
                if (*(bool *)((long)local_80 + 0x30) == true) {
                  boost::asio::detail::posix_event::
                  signal_all<boost::asio::detail::conditionally_enabled_mutex::scoped_lock>
                            (&(piVar1->wakeup_event_).event_,(scoped_lock *)local_80);
                }
                unique0x10000621 = (select_interrupter *)CONCAT44(eStack_40.fd,local_48._4_4_);
                if ((piVar1->task_interrupted_ == false) &&
                   (prVar2 = piVar1->task_,
                   unique0x10000629 = (select_interrupter *)CONCAT44(eStack_40.fd,local_48._4_4_),
                   prVar2 != (reactor *)0x0)) {
                  piVar1->task_interrupted_ = true;
                  local_48._0_4_ = 0x80000009;
                  unique0x00004780 = &prVar2->interrupter_;
                  epoll_ctl(prVar2->epoll_fd_,3,(prVar2->interrupter_).read_descriptor_,
                            (epoll_event *)local_48);
                }
                if (local_78._0_1_ == true) {
                  pthread_mutex_unlock((pthread_mutex_t *)((long)local_80 + 8));
                }
                std::thread::join();
                goto LAB_0013679a;
              }
              local_80[0] = 0x80;
              send(this,(int)(time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                              *)local_80,(void *)0x1,(size_t)completion_cond,in_R8D);
              (**this->_vptr_Serial)(this);
              iVar3 = iVar3 + 1;
            }
            bVar6 = this->dataReady;
          } while ((bool)bVar6 != true);
        }
        this->isReading = true;
LAB_0013679a:
        std::unique_lock<std::mutex>::~unique_lock(&local_60);
        goto LAB_0013660a;
      }
    }
  }
  bVar6 = 0;
LAB_0013660a:
  return (bool)(bVar6 & 1);
}

Assistant:

bool Serial::startReading() {
    if (!connected()) return false;

    if (!data) {
      CERR("[create::Serial] ", "data pointer not initialized.");
      return false;
    }

    // Only allow once
    if (isReading) return true;

    // Start OI
    sendOpcode(OC_START);

    if (!startSensorStream()) return false;

    io.reset();

    // Start continuously reading one byte at a time
    boost::asio::async_read(port,
                            boost::asio::buffer(&byteRead, 1),
                            std::bind(&Serial::onData,
                                      shared_from_this(),
                                      std::placeholders::_1,
                                      std::placeholders::_2));

    ioThread = std::thread(std::bind(
        static_cast<std::size_t(boost::asio::io_service::*)(void)>(
          &boost::asio::io_service::run), &io));

    // Wait for first complete read to finish
    std::unique_lock<std::mutex> lock(dataReadyMut);

    int attempts = 1;
    int maxAttempts = 10;
    while (!dataReady) {
      if (dataReadyCond.wait_for(lock, std::chrono::milliseconds(500)) == std::cv_status::timeout) {
        if (attempts >= maxAttempts) {
          CERR("[create::Serial] ", "failed to receive data from Create. Check if robot is powered!");
          io.stop();
          ioThread.join();
          return false;
        }
        attempts++;

        // Request data again
        sendOpcode(OC_START);
        startSensorStream();
      }
    }

    isReading = true;
    return true;
  }